

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

UnknownFieldSet * __thiscall
google::protobuf::UnknownFieldSet::AddGroup(UnknownFieldSet *this,int number)

{
  undefined1 local_28 [8];
  UnknownField field;
  
  local_28._4_4_ = 4;
  local_28._0_4_ = number;
  field._0_8_ = operator_new(0x18);
  *(undefined8 *)field._0_8_ = 0;
  *(undefined8 *)(field._0_8_ + 8) = 0;
  *(undefined8 *)(field._0_8_ + 0x10) = 0;
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  push_back(&this->fields_,(value_type *)local_28);
  return (UnknownFieldSet *)field._0_8_;
}

Assistant:

UnknownFieldSet* UnknownFieldSet::AddGroup(int number) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_GROUP);
  field.data_.group_ = new UnknownFieldSet;
  fields_.push_back(field);
  return field.data_.group_;
}